

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O3

aiReturn __thiscall Assimp::BlobIOStream::Seek(BlobIOStream *this,size_t pOffset,aiOrigin pOrigin)

{
  ulong uVar1;
  
  if (pOrigin != aiOrigin_SET) {
    if (pOrigin == aiOrigin_END) {
      pOffset = this->file_size - pOffset;
      this->cursor = pOffset;
      goto LAB_002f10b5;
    }
    if (pOrigin != aiOrigin_CUR) {
      return aiReturn_FAILURE;
    }
    pOffset = pOffset + this->cursor;
  }
  this->cursor = pOffset;
LAB_002f10b5:
  uVar1 = this->file_size;
  if (uVar1 < pOffset) {
    Grow(this,pOffset);
    uVar1 = this->file_size;
    pOffset = this->cursor;
  }
  if (uVar1 < pOffset) {
    uVar1 = pOffset;
  }
  this->file_size = uVar1;
  return aiReturn_SUCCESS;
}

Assistant:

virtual aiReturn Seek(size_t pOffset,
        aiOrigin pOrigin)
    {
        switch(pOrigin)
        {
        case aiOrigin_CUR:
            cursor += pOffset;
            break;

        case aiOrigin_END:
            cursor = file_size - pOffset;
            break;

        case aiOrigin_SET:
            cursor = pOffset;
            break;

        default:
            return AI_FAILURE;
        }

        if (cursor > file_size) {
            Grow(cursor);
        }

        file_size = std::max(cursor,file_size);
        return AI_SUCCESS;
    }